

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool __thiscall CRPCTable::removeCommand(CRPCTable *this,string *name,CRPCCommand *pcmd)

{
  bool bVar1;
  iterator iVar2;
  __normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
  __first;
  long in_FS_OFFSET;
  CRPCCommand *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = pcmd;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header) {
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<CRPCCommand_const**,std::vector<CRPCCommand_const*,std::allocator<CRPCCommand_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<CRPCCommand_const*const>>
                        (*(CRPCCommand ***)(iVar2._M_node + 2),
                         (__normal_iterator<const_CRPCCommand_**,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
                          )iVar2._M_node[2]._M_parent,&local_20);
    if (iVar2._M_node[2]._M_parent != (_Base_ptr)__first._M_current) {
      std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::erase
                ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                 (iVar2._M_node + 2),(const_iterator)__first._M_current,
                 (const_iterator)iVar2._M_node[2]._M_parent);
      bVar1 = true;
      goto LAB_00325bdc;
    }
  }
  bVar1 = false;
LAB_00325bdc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CRPCTable::removeCommand(const std::string& name, const CRPCCommand* pcmd)
{
    auto it = mapCommands.find(name);
    if (it != mapCommands.end()) {
        auto new_end = std::remove(it->second.begin(), it->second.end(), pcmd);
        if (it->second.end() != new_end) {
            it->second.erase(new_end, it->second.end());
            return true;
        }
    }
    return false;
}